

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# breadcrumb.c
# Opt level: O1

CgreenBreadcrumb * create_breadcrumb(void)

{
  CgreenBreadcrumb *pCVar1;
  
  pCVar1 = (CgreenBreadcrumb *)malloc(0x10);
  if (pCVar1 != (CgreenBreadcrumb *)0x0) {
    pCVar1->trail = (char **)0x0;
    pCVar1->depth = 0;
    pCVar1->space = 0;
    return pCVar1;
  }
  return (CgreenBreadcrumb *)0x0;
}

Assistant:

CgreenBreadcrumb *create_breadcrumb(void) {
    CgreenBreadcrumb *breadcrumb = (CgreenBreadcrumb *) malloc(sizeof(CgreenBreadcrumb));
    if (breadcrumb == NULL) {
        return NULL;
    }
    breadcrumb->trail = NULL;
    breadcrumb->depth = 0;
    breadcrumb->space = 0;
    return breadcrumb;
}